

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

void __thiscall
google::protobuf::util::MessageDifferencer::MessageDifferencer(MessageDifferencer *this)

{
  MessageDifferencer *this_local;
  
  this->reporter_ = (Reporter *)0x0;
  DefaultFieldComparator::DefaultFieldComparator(&this->default_field_comparator_);
  this->message_field_comparison_ = EQUAL;
  this->scope_ = FULL;
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::FieldDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::flat_hash_set(&this->force_compare_no_presence_fields_);
  TextFormat::Parser::UnsetFieldsMetadata::UnsetFieldsMetadata(&this->require_no_presence_fields_);
  absl::lts_20250127::
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flat_hash_set(&this->force_compare_failure_triggering_fields_);
  this->repeated_field_comparison_ = AS_LIST;
  absl::lts_20250127::
  flat_hash_map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>_>_>
  ::flat_hash_map(&this->repeated_field_comparisons_);
  std::
  vector<google::protobuf::util::MessageDifferencer::MapKeyComparator_*,_std::allocator<google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>
  ::vector(&this->owned_key_comparators_);
  absl::lts_20250127::
  flat_hash_map<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>_>
  ::flat_hash_map(&this->map_field_key_comparator_);
  MapEntryKeyComparator::MapEntryKeyComparator(&this->map_entry_key_comparator_,this);
  std::
  vector<std::unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>,_std::allocator<std::unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>_>_>
  ::vector(&this->ignore_criteria_);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(&this->tmp_message_fields_);
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::FieldDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::flat_hash_set(&this->ignored_fields_);
  (this->field_comparator_).default_impl = &this->default_field_comparator_;
  this->field_comparator_kind_ = kFCDefault;
  this->report_matches_ = false;
  this->report_moves_ = true;
  this->report_ignores_ = true;
  this->force_compare_no_presence_ = false;
  this->output_string_ = (string *)0x0;
  std::function<void(std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*)>::
  function<void(&)(std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*),void>
            ((function<void(std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*)>
              *)&this->match_indices_for_smart_list_callback_,MatchIndicesPostProcessorForSmartList)
  ;
  UnpackAnyField::UnpackAnyField(&this->unpack_any_field_);
  return;
}

Assistant:

MessageDifferencer::MessageDifferencer()
    : reporter_(nullptr),
      message_field_comparison_(EQUAL),
      scope_(FULL),
      repeated_field_comparison_(AS_LIST),
      map_entry_key_comparator_(this),
      report_matches_(false),
      report_moves_(true),
      report_ignores_(true),
      output_string_(nullptr),
      match_indices_for_smart_list_callback_(
          MatchIndicesPostProcessorForSmartList) {}